

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hh
# Opt level: O3

integer_t __thiscall
tchecker::vm_t::interpret_instruction
          (vm_t *this,bytecode_t **bytecode,intval_t *intval,clock_constraint_container_t *clkconstr
          ,clock_reset_container_t *clkreset)

{
  bytecode_t *pbVar1;
  bytecode_t id;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ostream *poVar6;
  out_of_range *this_00;
  integer_t *piVar7;
  mapped_type_conflict1 *pmVar8;
  pointer plVar9;
  pointer plVar10;
  runtime_error *this_01;
  pointer plVar11;
  char *__function;
  int iVar12;
  iterator iVar13;
  long *plVar14;
  int iVar15;
  _Rb_tree<long,_std::pair<const_long,_int>,_std::_Select1st<std::pair<const_long,_int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>
  *this_02;
  long lVar16;
  uint left_id;
  uint right_id;
  int value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  ineq_cmp_t local_1ac;
  ulong local_1a8 [2];
  undefined1 local_198 [376];
  
  pbVar1 = *bytecode;
  lVar16 = 1;
  switch(*pbVar1) {
  case 0:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      lVar16 = plVar9[-1];
      if ((int)lVar16 != lVar16) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar9 + -1;
      if (plVar9 + -1 != plVar10) {
        __assert_fail("size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                      ,0xed,
                      "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                     );
      }
      this->_return = true;
      goto switchD_001ab582_caseD_1d;
    }
    break;
  case 1:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      lVar16 = plVar9[-1];
      if ((int)lVar16 != lVar16) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      if ((int)lVar16 != 0) goto switchD_001ab582_caseD_1d;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar10;
      this->_return = true;
      goto LAB_001ac05f;
    }
    break;
  case 2:
    lVar3 = pbVar1[1];
    *bytecode = pbVar1 + 2;
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (plVar10 !=
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if ((int)lVar3 != lVar3) {
        __assert_fail("contains_value<tchecker::integer_t>(l)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                      ,0x103,
                      "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                     );
      }
      lVar2 = pbVar1[2];
      if ((int)lVar2 != lVar2) {
        __assert_fail("contains_value<tchecker::integer_t>(h)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                      ,0x104,
                      "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                     );
      }
      lVar16 = plVar10[-1];
      if ((int)lVar16 != lVar16) {
        __assert_fail("contains_value<tchecker::integer_t>(offset)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                      ,0x105,
                      "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                     );
      }
      if ((lVar16 < lVar3) || (lVar2 < lVar16)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
        poVar6 = std::ostream::_M_insert<long>((long)local_198);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," out of [",9);
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
        this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::operator+(&local_1d0,"out-of-bounds value: ",&local_1f0);
        std::out_of_range::out_of_range(this_00,(string *)&local_1d0);
        __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      goto switchD_001ab582_caseD_1d;
    }
LAB_001ac5f6:
    __function = "T tchecker::vm_t::top() [T = long]";
    goto LAB_001ac5be;
  case 3:
    *bytecode = pbVar1 + pbVar1[1] + 1;
  case 0x1d:
switchD_001ab582_caseD_1d:
    return (integer_t)lVar16;
  case 4:
    *bytecode = pbVar1 + 1;
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (plVar10 !=
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      iVar12 = (int)plVar10[-1];
      if ((long)iVar12 != plVar10[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      lVar3 = pbVar1[1];
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar10 + -1;
      if (iVar12 != 0) goto switchD_001ab582_caseD_1d;
      *bytecode = *bytecode + lVar3;
      goto LAB_001ac05f;
    }
    break;
  case 5:
    *bytecode = pbVar1 + 1;
    local_1a8[0] = pbVar1[1];
    iVar13._M_current =
         (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                ((vector<long,std::allocator<long>> *)&this->_stack,iVar13,(long *)local_1a8);
      plVar14 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    else {
      *iVar13._M_current = local_1a8[0];
      plVar14 = iVar13._M_current + 1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar14;
    }
    if (plVar14 !=
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar16 = plVar14[-1];
      if ((int)lVar16 != lVar16) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      goto switchD_001ab582_caseD_1d;
    }
    break;
  case 6:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 == plVar10) {
LAB_001ac5df:
      __function = "T tchecker::vm_t::top() [T = unsigned short]";
      goto LAB_001ac5be;
    }
    uVar4 = plVar9[-1];
    if (0xffff < uVar4) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
LAB_001acc65:
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar13._M_current = plVar9 + -1;
    (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar13._M_current;
    if ((intval->super_integer_array_t).super_intval_base_t.super_array_capacity_t<unsigned_short>.
        _capacity <= (ushort)uVar4) {
      __assert_fail("id < intval.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                    ,0x133,
                    "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                   );
    }
    local_1a8[0] = (ulong)(int)(&(intval->super_integer_array_t)._fam)[uVar4];
    if (iVar13._M_current ==
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (&this->_stack,iVar13,(long *)local_1a8);
      plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      plVar9[-1] = local_1a8[0];
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar9;
    }
    if (plVar9 != plVar10) {
      lVar16 = plVar9[-1];
      if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
      goto LAB_001acc65;
    }
    break;
  case 7:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      lVar16 = plVar9[-1];
      if ((int)SUB84(lVar16,0) != lVar16) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar9 + -1;
      if (plVar9 + -1 != plVar10) {
        uVar4 = plVar9[-2];
        if (uVar4 < 0x10000) {
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar9 + -2;
          if ((intval->super_integer_array_t).super_intval_base_t.
              super_array_capacity_t<unsigned_short>._capacity <= (ushort)uVar4) {
            __assert_fail("id < intval.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                          ,0x13c,
                          "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                         );
          }
          (&(intval->super_integer_array_t)._fam)[uVar4] = SUB84(lVar16,0);
          goto switchD_001ab582_caseD_1d;
        }
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      goto LAB_001ac5df;
    }
    break;
  case 8:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      plVar11 = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar11;
      if (plVar11 != plVar10) {
        iVar15 = (int)plVar9[-2];
        if ((long)iVar15 != plVar9[-2]) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        iVar13._M_current = plVar9 + -2;
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
        local_1a8[0] = (ulong)(iVar12 != 0 && iVar15 != 0);
        if (iVar13._M_current ==
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->_stack,iVar13,(long *)local_1a8);
          plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar11 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar13._M_current = local_1a8[0];
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar11;
        }
        if (plVar11 != plVar10) {
          lVar16 = plVar11[-1];
          if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
    }
    break;
  case 9:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      plVar11 = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar11;
      if (plVar11 != plVar10) {
        iVar15 = (int)plVar9[-2];
        if ((long)iVar15 != plVar9[-2]) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        iVar13._M_current = plVar9 + -2;
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
        local_1a8[0] = (ulong)(iVar15 - iVar12);
        if (iVar13._M_current ==
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->_stack,iVar13,(long *)local_1a8);
          plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar11 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar13._M_current = local_1a8[0];
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar11;
        }
        if (plVar11 != plVar10) {
          lVar16 = plVar11[-1];
          if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
    }
    break;
  case 10:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      plVar11 = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar11;
      if (plVar11 != plVar10) {
        uVar4 = plVar9[-2];
        if ((long)(int)uVar4 != uVar4) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        iVar13._M_current = plVar9 + -2;
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
        local_1a8[0] = (ulong)(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 |
                                          uVar4 & 0xffffffff) / (long)iVar12);
        if (iVar13._M_current ==
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->_stack,iVar13,(long *)local_1a8);
          plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar11 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar13._M_current = local_1a8[0];
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar11;
        }
        if (plVar11 != plVar10) {
          lVar16 = plVar11[-1];
          if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
    }
    break;
  case 0xb:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      plVar11 = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar11;
      if (plVar11 != plVar10) {
        iVar15 = (int)plVar9[-2];
        if ((long)iVar15 != plVar9[-2]) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        iVar13._M_current = plVar9 + -2;
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
        local_1a8[0] = (ulong)(iVar15 == iVar12);
        if (iVar13._M_current ==
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->_stack,iVar13,(long *)local_1a8);
          plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar11 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar13._M_current = local_1a8[0];
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar11;
        }
        if (plVar11 != plVar10) {
          lVar16 = plVar11[-1];
          if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
    }
    break;
  case 0xc:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      plVar11 = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar11;
      if (plVar11 != plVar10) {
        iVar15 = (int)plVar9[-2];
        if ((long)iVar15 != plVar9[-2]) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        iVar13._M_current = plVar9 + -2;
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
        local_1a8[0] = (ulong)(iVar12 <= iVar15);
        if (iVar13._M_current ==
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->_stack,iVar13,(long *)local_1a8);
          plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar11 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar13._M_current = local_1a8[0];
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar11;
        }
        if (plVar11 != plVar10) {
          lVar16 = plVar11[-1];
          if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
    }
    break;
  case 0xd:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      plVar11 = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar11;
      if (plVar11 != plVar10) {
        iVar15 = (int)plVar9[-2];
        if ((long)iVar15 != plVar9[-2]) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        iVar13._M_current = plVar9 + -2;
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
        local_1a8[0] = (ulong)(iVar12 < iVar15);
        if (iVar13._M_current ==
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->_stack,iVar13,(long *)local_1a8);
          plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar11 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar13._M_current = local_1a8[0];
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar11;
        }
        if (plVar11 != plVar10) {
          lVar16 = plVar11[-1];
          if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
    }
    break;
  case 0xe:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      plVar11 = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar11;
      if (plVar11 != plVar10) {
        iVar15 = (int)plVar9[-2];
        if ((long)iVar15 != plVar9[-2]) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        iVar13._M_current = plVar9 + -2;
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
        local_1a8[0] = (ulong)(iVar15 < iVar12);
        if (iVar13._M_current ==
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->_stack,iVar13,(long *)local_1a8);
          plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar11 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar13._M_current = local_1a8[0];
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar11;
        }
        if (plVar11 != plVar10) {
          lVar16 = plVar11[-1];
          if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
    }
    break;
  case 0xf:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      plVar11 = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar11;
      if (plVar11 != plVar10) {
        iVar15 = (int)plVar9[-2];
        if ((long)iVar15 != plVar9[-2]) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        iVar13._M_current = plVar9 + -2;
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
        local_1a8[0] = (ulong)(iVar15 <= iVar12);
        if (iVar13._M_current ==
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->_stack,iVar13,(long *)local_1a8);
          plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar11 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar13._M_current = local_1a8[0];
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar11;
        }
        if (plVar11 != plVar10) {
          lVar16 = plVar11[-1];
          if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
    }
    break;
  case 0x10:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      plVar11 = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar11;
      if (plVar11 != plVar10) {
        iVar15 = (int)plVar9[-2];
        if ((long)iVar15 != plVar9[-2]) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        iVar13._M_current = plVar9 + -2;
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
        local_1a8[0] = (ulong)(iVar12 * iVar15);
        if (iVar13._M_current ==
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->_stack,iVar13,(long *)local_1a8);
          plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar11 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar13._M_current = local_1a8[0];
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar11;
        }
        if (plVar11 != plVar10) {
          lVar16 = plVar11[-1];
          if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
    }
    break;
  case 0x11:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      plVar11 = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar11;
      if (plVar11 != plVar10) {
        uVar4 = plVar9[-2];
        if ((long)(int)uVar4 != uVar4) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        iVar13._M_current = plVar9 + -2;
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
        local_1a8[0] = (ulong)(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 |
                                          uVar4 & 0xffffffff) % (long)iVar12);
        if (iVar13._M_current ==
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->_stack,iVar13,(long *)local_1a8);
          plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar11 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar13._M_current = local_1a8[0];
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar11;
        }
        if (plVar11 != plVar10) {
          lVar16 = plVar11[-1];
          if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
    }
    break;
  case 0x12:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      plVar11 = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar11;
      if (plVar11 != plVar10) {
        iVar15 = (int)plVar9[-2];
        if ((long)iVar15 != plVar9[-2]) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        iVar13._M_current = plVar9 + -2;
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
        local_1a8[0] = (ulong)(iVar15 != iVar12);
        if (iVar13._M_current ==
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->_stack,iVar13,(long *)local_1a8);
          plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar11 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar13._M_current = local_1a8[0];
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar11;
        }
        if (plVar11 != plVar10) {
          lVar16 = plVar11[-1];
          if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
    }
    break;
  case 0x13:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      plVar11 = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar11;
      if (plVar11 != plVar10) {
        iVar15 = (int)plVar9[-2];
        if ((long)iVar15 != plVar9[-2]) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        iVar13._M_current = plVar9 + -2;
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
        local_1a8[0] = (ulong)(iVar15 + iVar12);
        if (iVar13._M_current ==
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&this->_stack,iVar13,(long *)local_1a8);
          plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar11 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar13._M_current = local_1a8[0];
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar11;
        }
        if (plVar11 != plVar10) {
          lVar16 = plVar11[-1];
          if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
    }
    break;
  case 0x14:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      iVar13._M_current = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = iVar13._M_current;
      local_1a8[0] = (ulong)-iVar12;
      if (iVar13._M_current ==
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&this->_stack,iVar13,(long *)local_1a8);
        plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        plVar9[-1] = local_1a8[0];
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = plVar9;
      }
      if (plVar9 != plVar10) {
        lVar16 = plVar9[-1];
        if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
    }
    break;
  case 0x15:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      iVar13._M_current = plVar9 + -1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = iVar13._M_current;
      local_1a8[0] = (ulong)(iVar12 == 0);
      if (iVar13._M_current ==
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&this->_stack,iVar13,(long *)local_1a8);
        plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        plVar9[-1] = local_1a8[0];
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = plVar9;
      }
      if (plVar9 != plVar10) {
        lVar16 = plVar9[-1];
        if ((int)lVar16 == lVar16) goto switchD_001ab582_caseD_1d;
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
    }
    break;
  case 0x16:
    *bytecode = pbVar1 + 1;
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      lVar3 = pbVar1[1];
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar9 + -1;
      local_1a8[0] = CONCAT44(local_1a8[0]._4_4_,iVar12);
      if (plVar9 + -1 != plVar10) {
        uVar4 = plVar9[-2];
        if (uVar4 >> 0x20 != 0) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = plVar9 + -2;
        local_1d0._M_dataplus._M_p._0_4_ = (undefined4)uVar4;
        if (plVar9 + -2 != plVar10) {
          uVar4 = plVar9[-3];
          if (uVar4 >> 0x20 == 0) {
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = plVar9 + -3;
            local_1f0._M_dataplus._M_p._0_4_ = (undefined4)uVar4;
            local_1ac = (ineq_cmp_t)(lVar3 != 0);
            std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>::
            emplace_back<unsigned_int_const&,unsigned_int_const&,tchecker::ineq_cmp_t,int_const&>
                      ((vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>
                        *)clkconstr,(uint *)&local_1f0,(uint *)&local_1d0,&local_1ac,
                       (int *)local_1a8);
            goto switchD_001ab582_caseD_1d;
          }
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
LAB_001ac5c8:
      __function = "T tchecker::vm_t::top() [T = unsigned int]";
      goto LAB_001ac5be;
    }
    break;
  case 0x17:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      iVar12 = (int)plVar9[-1];
      if ((long)iVar12 != plVar9[-1]) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar9 + -1;
      local_1a8[0] = CONCAT44(local_1a8[0]._4_4_,iVar12);
      if (plVar9 + -1 != plVar10) {
        uVar4 = plVar9[-2];
        if (uVar4 >> 0x20 != 0) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = plVar9 + -2;
        local_1d0._M_dataplus._M_p._0_4_ = (undefined4)uVar4;
        if (plVar9 + -2 != plVar10) {
          uVar4 = plVar9[-3];
          if (uVar4 >> 0x20 == 0) {
            (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = plVar9 + -3;
            local_1f0._M_dataplus._M_p._0_4_ = (undefined4)uVar4;
            std::vector<tchecker::clock_reset_t,std::allocator<tchecker::clock_reset_t>>::
            emplace_back<unsigned_int_const&,unsigned_int_const&,int_const&>
                      ((vector<tchecker::clock_reset_t,std::allocator<tchecker::clock_reset_t>> *)
                       clkreset,(uint *)&local_1f0,(uint *)&local_1d0,(int *)local_1a8);
            goto switchD_001ab582_caseD_1d;
          }
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
          goto LAB_001acc65;
        }
      }
      goto LAB_001ac5c8;
    }
    break;
  case 0x18:
    std::
    vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
    ::emplace_back<>(&this->_frames);
    goto switchD_001ab582_caseD_1d;
  case 0x19:
    this_02 = &(this->_frames).
               super__Vector_base<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t;
    (this->_frames).
    super__Vector_base<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_02;
    std::
    _Rb_tree<long,_std::pair<const_long,_int>,_std::_Select1st<std::pair<const_long,_int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>
    ::~_Rb_tree(this_02);
    goto switchD_001ab582_caseD_1d;
  case 0x1a:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (plVar10 ==
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_001ac5f6;
    id = plVar10[-1];
    (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = plVar10 + -1;
    piVar7 = slot_of(this,id);
    local_1a8[0] = (ulong)*piVar7;
    iVar13._M_current =
         (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (&this->_stack,iVar13,(long *)local_1a8);
      plVar14 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    else {
      *iVar13._M_current = local_1a8[0];
      plVar14 = iVar13._M_current + 1;
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar14;
    }
    if (plVar14 !=
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar16 = plVar14[-1];
      if ((int)lVar16 != lVar16) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      goto switchD_001ab582_caseD_1d;
    }
    break;
  case 0x1b:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 != plVar10) {
      lVar16 = plVar9[-1];
      if ((int)lVar16 != lVar16) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar9 + -1;
      if (plVar9 + -1 != plVar10) {
        uVar4 = plVar9[-2];
        if (uVar4 >> 0x20 == 0) {
          (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = plVar9 + -2;
          piVar7 = slot_of(this,uVar4);
          *piVar7 = (int)lVar16;
          goto switchD_001ab582_caseD_1d;
        }
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
        goto LAB_001acc65;
      }
      goto LAB_001ac5c8;
    }
    break;
  case 0x1c:
    plVar10 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar9 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar9 == plVar10) goto LAB_001ac5c8;
    uVar4 = plVar9[-1];
    if (uVar4 >> 0x20 != 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
      goto LAB_001acc65;
    }
    (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = plVar9 + -1;
    if (plVar9 + -1 == plVar10) goto LAB_001ac5df;
    uVar5 = plVar9[-2];
    if (0xffff < uVar5) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"vm_t::top, value out-of-bounds");
      goto LAB_001acc65;
    }
    (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = plVar9 + -2;
    local_1a8[0] = uVar5;
    pmVar8 = std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>::
             operator[]((this->_frames).
                        super__Vector_base<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,
                        (key_type_conflict *)local_1a8);
    *pmVar8 = (mapped_type_conflict1)uVar4;
LAB_001ac05f:
    lVar16 = 0;
    goto switchD_001ab582_caseD_1d;
  default:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"incomplete switch statement");
    goto LAB_001acc65;
  }
  __function = "T tchecker::vm_t::top() [T = int]";
LAB_001ac5be:
  __assert_fail("_stack.size() >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                ,0x222,__function);
}

Assistant:

inline tchecker::integer_t interpret_instruction(tchecker::bytecode_t const *& bytecode, tchecker::intval_t & intval,
                                                   tchecker::clock_constraint_container_t & clkconstr,
                                                   tchecker::clock_reset_container_t & clkreset)
  {
    // Assume stack=v1 ... vK where vK is the top symbol
    switch (*bytecode) {
      // end of operation, return vK
    case VM_RET: {
      auto val = top_and_pop<tchecker::integer_t>();
      assert(size() == 0);
      clear();
      _return = true;
      return val;
    }

      // end of operation when vK==0, return 0
    case VM_RETZ: {
      if (top<tchecker::integer_t>() == 0) {
        clear();
        _return = true;
        return 0;
      }
      return top<tchecker::integer_t>();
    }

      // raise exception when not (l <= vK <= h) for parameters l and h
      // of instruction VM_FAILNOTIN
    case VM_FAILNOTIN: {
      tchecker::bytecode_t const l = *++bytecode;
      tchecker::bytecode_t const h = *++bytecode;
      auto const offset = top<tchecker::bytecode_t>();
      assert(contains_value<tchecker::integer_t>(l));
      assert(contains_value<tchecker::integer_t>(h));
      assert(contains_value<tchecker::integer_t>(offset));
      if ((offset < l) || (offset > h)) {
        std::stringstream ss;
        ss << offset << " out of [" << l << ", " << h << "]";
        throw std::out_of_range("out-of-bounds value: " + ss.str());
      }

      return top<tchecker::integer_t>();
    }

      // unconditional jump relatively to next instruction;
      // offset is a parameter of the instruction
    case VM_JMP: {
      tchecker::bytecode_t const shift = *++bytecode;
      // jump is relative to the address of the next instruction:
      // - bytecode++;
      // but we have to handle the increment of the IP in the main loop:
      // - bytecode += shift - 1;
      // so:
      bytecode += shift;

      return 1;
    }
      // stack = v1 ... vK   jump if vK == 0
      // offset is a parameter of the instruction
    case VM_JMPZ: {
      tchecker::bytecode_t const shift = *++bytecode;

      if (top_and_pop<tchecker::integer_t>() == 0) {
        bytecode += shift;
        return 0;
      }
      return 1;
    }

      // stack = v1 ... vK v   where v is a parameter of instruction VM_PUSH
    case VM_PUSH: {
      tchecker::bytecode_t const v = *++bytecode;
      push<tchecker::bytecode_t>(v);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... [vK]   vK replaced by value at ID vK in intvars
      // valuation
    case VM_VALUEAT: {
      auto const id = top_and_pop<tchecker::intval_base_t::capacity_t>();
      assert(id < intval.size());
      push<tchecker::integer_t>(intval[id]);
      return top<tchecker::integer_t>();
    }

      // [vK-1] = vK, stack = v1 ... vK-2
    case VM_ASSIGN: {
      auto const value = top_and_pop<tchecker::integer_t>();
      auto const id = top_and_pop<tchecker::intval_base_t::capacity_t>();
      assert(id < intval.size());
      intval[id] = value;
      return value;
    }

      // stack = v1 ... vK-2 (vK-1 && vK)
    case VM_LAND: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left && right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 - vK)
    case VM_MINUS: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left - right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 / vK)
    case VM_DIV: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left / right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 == vK)
    case VM_EQ: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left == right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 >= vK)
    case VM_GE: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left >= right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 > vK)
    case VM_GT: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left > right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 < vK)
    case VM_LT: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left < right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 <= vK)
    case VM_LE: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left <= right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 * vK)
    case VM_MUL: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left * right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 % vK)
    case VM_MOD: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left % right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 != vK)
    case VM_NE: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left != right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 + vK)
    case VM_SUM: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left + right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-1 (- vK)
    case VM_NEG: {
      auto const v = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(-v);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-1 (! vK)
    case VM_LNOT: {
      auto const v = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(!v);
      return top<tchecker::integer_t>();
    }

      // no-operation
    case VM_NOP:
      return 1;

      // stack = v1 ... vK-4 1  output (vK-2 vK-1 s vK)   where s is a
      // parameter of VM_CLKCONSTR (strictness)
    case VM_CLKCONSTR: {
      tchecker::bytecode_t cmp = *++bytecode;
      auto const bound = top_and_pop<tchecker::integer_t>();
      auto const id2 = top_and_pop<tchecker::clock_id_t>();
      auto const id1 = top_and_pop<tchecker::clock_id_t>();
      static_assert(tchecker::LT == 0, "");
      clkconstr.emplace_back(id1, id2, (cmp == 0 ? tchecker::LT : tchecker::LE), bound);
      return 1;
    }

      // stack = v1 ... vK-3    output (vK-2 vK-1 vK)
    case VM_CLKRESET: {
      auto const value = top_and_pop<tchecker::integer_t>();
      auto const right_id = top_and_pop<tchecker::clock_id_t>();
      auto const left_id = top_and_pop<tchecker::clock_id_t>();
      clkreset.emplace_back(left_id, right_id, value);
      return 1;
    }

      // push a new frame for local variables
    case VM_PUSH_FRAME: {
      _frames.emplace_back();
      return 1;
    }
      // pop the top-level frame
    case VM_POP_FRAME: {
      _frames.pop_back();
      return 1;
    }

      // stack = v1 ... vK-1 [vK]
      // vK is replaced by the value of the local variable identified by vK.
    case VM_VALUEAT_FRAME: {
      auto const id = top_and_pop<tchecker::bytecode_t>();
      push<tchecker::integer_t>(slot_of(id));
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2
      // [vK-1] is assigned vK where vK-1 identifies a local variables.
    case VM_ASSIGN_FRAME: {
      auto const value = top_and_pop<tchecker::integer_t>();
      auto const id = top_and_pop<tchecker::intvar_id_t>();
      slot_of(id) = value;
      return value;
    }

      // stack = v1 ... vK-2
      // [vK-1] is initialized with vK where vK-1 identifies a local variables.
    case VM_INIT_FRAME: {
      auto const value = top_and_pop<tchecker::intvar_id_t>();
      auto const id = top_and_pop<tchecker::intval_base_t::capacity_t>();
      _frames.back()[id] = static_cast<tchecker::integer_t>(value);

      return 0;
    }
    }

    // should never be reached
    throw std::runtime_error("incomplete switch statement");
  }